

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_urbg.cc
# Opt level: O3

result_type_conflict3
absl::lts_20250127::random_internal::RandenPool<unsigned_short>::Generate(void)

{
  SpinLock *this;
  uint uVar1;
  uint32_t uVar2;
  void *keys_void;
  size_t sVar3;
  uint uVar4;
  RandenPoolEntry *state_void;
  
  state_void = anon_unknown_0::GetPoolForCurrentThread();
  this = &state_void->mu_;
  uVar1 = (state_void->mu_).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 & 1) == 0) {
    LOCK();
    uVar4 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if (uVar1 == uVar4) {
      (this->lockword_).super___atomic_base<unsigned_int>._M_i = uVar1 | 1;
      uVar4 = uVar1;
    }
    UNLOCK();
    if ((uVar4 & 1) == 0) goto LAB_0032b8d2;
  }
  base_internal::SpinLock::SlowLock(this);
LAB_0032b8d2:
  if (0x3f < state_void->next_) {
    state_void->next_ = 4;
    keys_void = (state_void->impl_).keys_;
    if ((state_void->impl_).has_crypto_ == true) {
      RandenHwAes::Generate(keys_void,state_void);
    }
    else {
      RandenSlow::Generate(keys_void,state_void);
    }
  }
  sVar3 = state_void->next_;
  state_void->next_ = sVar3 + 1;
  uVar2 = state_void->state_[sVar3];
  LOCK();
  uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
  (this->lockword_).super___atomic_base<unsigned_int>._M_i =
       (this->lockword_).super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if (7 < uVar1) {
    base_internal::SpinLock::SlowUnlock(this,uVar1);
  }
  return (result_type_conflict3)uVar2;
}

Assistant:

typename RandenPool<T>::result_type RandenPool<T>::Generate() {
  auto* pool = GetPoolForCurrentThread();
  return pool->Generate<T>();
}